

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhotonMap.cpp
# Opt level: O0

void __thiscall
PhotonMap::query(PhotonMap *this,int u,int dim,vector<int,_std::allocator<int>_> *res,Vector3 *P,
                double R)

{
  const_reference pvVar1;
  double *pdVar2;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  Vector3 *in_R8;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double dis2;
  Vector3 Pu;
  Vector3 *in_stack_ffffffffffffff50;
  Vector3 *in_stack_ffffffffffffff58;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff60;
  double dVar3;
  Vector3 local_68;
  double local_50;
  Vector3 local_48;
  double in_stack_ffffffffffffffd0;
  Vector3 *P_00;
  
  P_00 = (Vector3 *)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  if (in_ESI != 0) {
    pvVar1 = std::vector<Photon,_std::allocator<Photon>_>::operator[]
                       ((vector<Photon,_std::allocator<Photon>_> *)(in_RDI + 8),(long)in_ESI);
    local_48.z = (pvVar1->ray).O.z;
    local_48.x = (pvVar1->ray).O.x;
    local_48.y = (pvVar1->ray).O.y;
    operator-(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
    dVar3 = Vector3::len2(&local_68);
    Vector3::~Vector3(&local_68);
    local_50 = dVar3;
    if (dVar3 <= (double)P_00 * (double)P_00) {
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_ffffffffffffff60,(value_type_conflict *)in_stack_ffffffffffffff58);
    }
    pdVar2 = Vector3::operator[](&local_48,in_EDX);
    dVar3 = *pdVar2;
    pdVar2 = Vector3::operator[](in_R8,in_EDX);
    if (dVar3 - *pdVar2 <= (double)P_00) {
      std::vector<Info,_std::allocator<Info>_>::operator[]
                ((vector<Info,_std::allocator<Info>_> *)(in_RDI + 0x20),(long)in_ESI);
      query((PhotonMap *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
            (vector<int,_std::allocator<int>_> *)in_R8,P_00,in_stack_ffffffffffffffd0);
    }
    pdVar2 = Vector3::operator[](in_R8,in_EDX);
    dVar3 = *pdVar2;
    pdVar2 = Vector3::operator[](&local_48,in_EDX);
    if (dVar3 - *pdVar2 <= (double)P_00) {
      std::vector<Info,_std::allocator<Info>_>::operator[]
                ((vector<Info,_std::allocator<Info>_> *)(in_RDI + 0x20),(long)in_ESI);
      query((PhotonMap *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),(int)in_RCX,
            (vector<int,_std::allocator<int>_> *)in_R8,P_00,in_stack_ffffffffffffffd0);
    }
    Vector3::~Vector3(&local_48);
  }
  return;
}

Assistant:

void PhotonMap::query(int u, int dim, std::vector<int> &res, const Vector3 &P, double R) const
{
    if (!u) return;
    Vector3 Pu = photons[u].ray.O;
    double dis2 = (Pu - P).len2();
    if (dis2 <= R * R) res.push_back(u);
    if (Pu[dim] - P[dim] <= R) query(nodes[u].r, (dim + 1) % 3, res, P, R);
    if (P[dim] - Pu[dim] <= R) query(nodes[u].l, (dim + 1) % 3, res, P, R);
}